

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

PktOut * pq_out_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  PacketQueueBase *node_00;
  PacketQueueNode *node;
  _Bool pop_local;
  PacketQueueNode *prev_local;
  PacketQueueBase *pqb_local;
  
  node_00 = (PacketQueueBase *)prev->next;
  if (node_00 == pqb) {
    pqb_local = (PacketQueueBase *)0x0;
  }
  else {
    if (pop) {
      pq_unlink_common(pqb,(PacketQueueNode *)node_00);
      (node_00->end).next = (PacketQueueNode *)0x0;
      (node_00->end).prev = (PacketQueueNode *)0x0;
    }
    pqb_local = (PacketQueueBase *)&node_00[-2].total_size;
  }
  return (PktOut *)pqb_local;
}

Assistant:

static PktOut *pq_out_after(PacketQueueBase *pqb,
                            PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = node->next = NULL;
    }

    return container_of(node, PktOut, qnode);
}